

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O3

void __thiscall Command_NoCalls_Test::TestBody(Command_NoCalls_Test *this)

{
  mock_cp *this_00;
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pTVar1;
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  *pFVar2;
  MatcherBase<const_pstore::brokerface::fifo_path_&> local_d0;
  MatcherBase<const_pstore::broker::broker_command_&> local_b8;
  MatcherBase<const_pstore::broker::broker_command_&> local_a0;
  MatcherBase<const_pstore::brokerface::fifo_path_&> local_88;
  MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  local_70;
  Command_NoCalls_Test *local_38;
  
  this_00 = &(this->super_Command).cp_;
  local_88.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_a0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  pFVar2 = &(this->super_Command).cp_.gmock02_suicide_42;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  local_d0.vtable_ = local_88.vtable_;
  local_d0.buffer_.ptr = local_88.buffer_.ptr;
  if ((local_88.vtable_ != (VTable *)0x0) &&
     ((local_88.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_b8.vtable_ = local_a0.vtable_;
  local_b8.buffer_.ptr = local_a0.buffer_.ptr;
  if ((local_a0.vtable_ != (VTable *)0x0) &&
     ((local_a0.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_70,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_d0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_b8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_d0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x59,"cp ()","suicide (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &local_70.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&local_70.matchers_);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_a0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_88);
  local_88.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_a0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  pFVar2 = &(this->super_Command).cp_.gmock02_quit_44;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  local_d0.vtable_ = local_88.vtable_;
  local_d0.buffer_.ptr = local_88.buffer_.ptr;
  if ((local_88.vtable_ != (VTable *)0x0) &&
     ((local_88.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_b8.vtable_ = local_a0.vtable_;
  local_b8.buffer_.ptr = local_a0.buffer_.ptr;
  if ((local_a0.vtable_ != (VTable *)0x0) &&
     ((local_a0.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_70,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_d0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_b8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_d0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5a,"cp ()","quit (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &local_70.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&local_70.matchers_);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_a0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_88);
  local_88.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_a0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  pFVar2 = &(this->super_Command).cp_.gmock02_cquit_46;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  local_d0.vtable_ = local_88.vtable_;
  local_d0.buffer_.ptr = local_88.buffer_.ptr;
  if ((local_88.vtable_ != (VTable *)0x0) &&
     ((local_88.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_b8.vtable_ = local_a0.vtable_;
  local_b8.buffer_.ptr = local_a0.buffer_.ptr;
  if ((local_a0.vtable_ != (VTable *)0x0) &&
     ((local_a0.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_70,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_d0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_b8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_d0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5b,"cp ()","cquit (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &local_70.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&local_70.matchers_);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_a0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_88);
  local_88.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_a0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  pFVar2 = &(this->super_Command).cp_.gmock02_gc_48;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  local_d0.vtable_ = local_88.vtable_;
  local_d0.buffer_.ptr = local_88.buffer_.ptr;
  if ((local_88.vtable_ != (VTable *)0x0) &&
     ((local_88.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_88.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_b8.vtable_ = local_a0.vtable_;
  local_b8.buffer_.ptr = local_a0.buffer_.ptr;
  if ((local_a0.vtable_ != (VTable *)0x0) &&
     ((local_a0.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_a0.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  local_38 = this;
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_70,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_d0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_b8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_d0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5c,"cp ()","gc (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &local_70.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&local_70.matchers_);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_a0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_88);
  local_88.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_a0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  pFVar2 = &(local_38->super_Command).cp_.gmock02_echo_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar2->super_UntypedFunctionMockerBase,this_00);
  local_d0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_b8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  testing::internal::
  FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::With(&local_70,pFVar2,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_d0,
         (Matcher<const_pstore::broker::broker_command_&> *)&local_b8);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_d0);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5d,"cp ()","echo (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &local_70.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&local_70.matchers_);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_a0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_88);
  local_d0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::fifo_path_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00195850;
  local_b8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::broker::broker_command_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::broker::broker_command_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_b8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001958f0;
  anon_unknown.dwarf_25e57::mock_cp::gmock_nop
            (&local_70,this_00,(Matcher<const_pstore::brokerface::fifo_path_&> *)&local_d0,
             (Matcher<const_pstore::broker::broker_command_&> *)&local_b8);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
           ::InternalExpectedAt
                     (&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                      ,0x5e,"cp ()","nop (_, _)");
  testing::internal::
  TypedExpectation<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
  ::Times(pTVar1,0);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::fifo_path_&> *)
             &local_70.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
              .super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>
            );
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase
            ((MatcherBase<const_pstore::broker::broker_command_&> *)&local_70.matchers_);
  testing::internal::MatcherBase<const_pstore::broker::broker_command_&>::~MatcherBase(&local_b8);
  testing::internal::MatcherBase<const_pstore::brokerface::fifo_path_&>::~MatcherBase(&local_d0);
  return;
}

Assistant:

TEST_F (Command, NoCalls) {
    using ::testing::_;
    EXPECT_CALL (cp (), suicide (_, _)).Times (0);
    EXPECT_CALL (cp (), quit (_, _)).Times (0);
    EXPECT_CALL (cp (), cquit (_, _)).Times (0);
    EXPECT_CALL (cp (), gc (_, _)).Times (0);
    EXPECT_CALL (cp (), echo (_, _)).Times (0);
    EXPECT_CALL (cp (), nop (_, _)).Times (0);
}